

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O2

value_type __thiscall
FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
::fastAccessDx(FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_Fad<double>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  value_type vVar4;
  value_type vVar5;
  
  vVar4 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar1 = (this->right_->dx_).ptr_to_data[i];
  dVar2 = this->right_->val_;
  vVar5 = FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>
          ::val(&this->left_->fadexpr_);
  dVar3 = this->right_->val_;
  return (vVar4 * dVar2 - vVar5 * dVar1) / (dVar3 * dVar3);
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}